

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O3

void __thiscall
webrtc::LappedTransform::BlockThunk::ProcessBlock
          (BlockThunk *this,float **input,size_t num_frames,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  RealFourier *pRVar1;
  float **ppfVar2;
  int iVar3;
  string *result;
  float *pfVar4;
  complex<float> *pcVar5;
  float *__src;
  LappedTransform *pLVar6;
  size_t sVar7;
  size_t block_length;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  float **local_1b8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  pLVar6 = this->parent_;
  local_1d0 = num_frames;
  local_1c8 = num_output_channels;
  local_1c0 = num_input_channels;
  if (pLVar6->num_in_channels_ != num_input_channels) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1c0,&pLVar6->num_in_channels_,
                        "num_input_channels == parent_->num_in_channels_");
    if (result != (string *)0x0) {
      iVar3 = 0x1b;
      goto LAB_001435c0;
    }
    pLVar6 = this->parent_;
  }
  if (pLVar6->num_out_channels_ != num_output_channels) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1c8,&pLVar6->num_out_channels_,
                        "num_output_channels == parent_->num_out_channels_");
    if (result != (string *)0x0) {
      iVar3 = 0x1c;
      goto LAB_001435c0;
    }
    pLVar6 = this->parent_;
    num_frames = local_1d0;
  }
  local_1b8 = output;
  if ((pLVar6->block_length_ != num_frames) &&
     (result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&pLVar6->block_length_,&local_1d0,"parent_->block_length_ == num_frames"),
     result != (string *)0x0)) {
    iVar3 = 0x1d;
LAB_001435c0:
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,iVar3,result);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  if (local_1c0 != 0) {
    sVar7 = 0;
    do {
      pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
      memcpy(pfVar4,input[sVar7],local_1d0 << 2);
      pRVar1 = (this->parent_->fft_)._M_t.
               super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
               ._M_t.
               super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
               .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
      pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
      pcVar5 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_pre_,sVar7);
      (*pRVar1->_vptr_RealFourier[2])(pRVar1,pfVar4,pcVar5);
      sVar7 = sVar7 + 1;
    } while (sVar7 < local_1c0);
  }
  iVar3 = RealFourier::FftOrder(0x143460);
  sVar7 = RealFourier::ComplexLength(iVar3);
  pLVar6 = this->parent_;
  local_1b0 = sVar7;
  if (pLVar6->cplx_length_ != sVar7) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&pLVar6->cplx_length_,&local_1b0,"parent_->cplx_length_ == block_length");
    if (result != (string *)0x0) {
      iVar3 = 0x28;
      goto LAB_001435c0;
    }
    pLVar6 = this->parent_;
    sVar7 = pLVar6->cplx_length_;
  }
  ppfVar2 = local_1b8;
  (*pLVar6->block_processor_->_vptr_Callback[2])
            (pLVar6->block_processor_,(pLVar6->cplx_pre_).head_row_,local_1c0,sVar7,local_1c8,
             (pLVar6->cplx_post_).head_row_);
  if (local_1c8 != 0) {
    sVar7 = 0;
    do {
      pRVar1 = (this->parent_->fft_)._M_t.
               super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
               ._M_t.
               super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
               .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
      pcVar5 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_post_,sVar7);
      pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
      (*pRVar1->_vptr_RealFourier[3])(pRVar1,pcVar5,pfVar4);
      pfVar4 = ppfVar2[sVar7];
      __src = AlignedArray<float>::Row(&this->parent_->real_buf_,sVar7);
      memcpy(pfVar4,__src,local_1d0 << 2);
      sVar7 = sVar7 + 1;
    } while (sVar7 < local_1c8);
  }
  return;
}

Assistant:

void LappedTransform::BlockThunk::ProcessBlock(const float* const* input,
                                               size_t num_frames,
                                               size_t num_input_channels,
                                               size_t num_output_channels,
                                               float* const* output) {
  RTC_CHECK_EQ(num_input_channels, parent_->num_in_channels_);
  RTC_CHECK_EQ(num_output_channels, parent_->num_out_channels_);
  RTC_CHECK_EQ(parent_->block_length_, num_frames);

  for (size_t i = 0; i < num_input_channels; ++i) {
    memcpy(parent_->real_buf_.Row(i), input[i],
           num_frames * sizeof(*input[0]));
    parent_->fft_->Forward(parent_->real_buf_.Row(i),
                           parent_->cplx_pre_.Row(i));
  }

  size_t block_length = RealFourier::ComplexLength(
      RealFourier::FftOrder(num_frames));
  RTC_CHECK_EQ(parent_->cplx_length_, block_length);
  parent_->block_processor_->ProcessAudioBlock(parent_->cplx_pre_.Array(),
                                               num_input_channels,
                                               parent_->cplx_length_,
                                               num_output_channels,
                                               parent_->cplx_post_.Array());

  for (size_t i = 0; i < num_output_channels; ++i) {
    parent_->fft_->Inverse(parent_->cplx_post_.Row(i),
                           parent_->real_buf_.Row(i));
    memcpy(output[i], parent_->real_buf_.Row(i),
           num_frames * sizeof(*input[0]));
  }
}